

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O2

bool peparse::readChar16(bounded_buffer *b,uint32_t offset,char16_t *out)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  ulong uVar3;
  uint8_t *puVar4;
  _func_ios_base_ptr_ios_base_ptr *f;
  _func_ios_base_ptr_ios_base_ptr *f_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  string local_28;
  
  if (b == (bounded_buffer *)0x0) {
    err = 10;
    std::__cxx11::string::assign((char *)&err_loc_abi_cxx11_);
    to_string<unsigned_int>(&local_28,0xac,f);
    std::operator+(&bStack_48,":",&local_28);
    std::__cxx11::string::append((string *)&err_loc_abi_cxx11_);
  }
  else {
    uVar3 = (ulong)offset;
    if (uVar3 + 1 < (ulong)b->bufLen) {
      puVar1 = b->buf + uVar3;
      puVar2 = b->buf + uVar3 + 1;
      puVar4 = puVar2;
      if (b->swapBytes == false) {
        puVar4 = puVar1;
        puVar1 = puVar2;
      }
      *out = CONCAT11(*puVar1,*puVar4);
      return true;
    }
    err = 0xb;
    std::__cxx11::string::assign((char *)&err_loc_abi_cxx11_);
    to_string<unsigned_int>(&local_28,0xb1,f_00);
    std::operator+(&bStack_48,":",&local_28);
    std::__cxx11::string::append((string *)&err_loc_abi_cxx11_);
  }
  std::__cxx11::string::~string((string *)&bStack_48);
  std::__cxx11::string::~string((string *)&local_28);
  return false;
}

Assistant:

bool readChar16(bounded_buffer *b, std::uint32_t offset, char16_t &out) {
  if (b == nullptr) {
    PE_ERR(PEERR_BUFFER);
    return false;
  }

  if (static_cast<std::uint64_t>(offset) + 1 >= b->bufLen) {
    PE_ERR(PEERR_ADDRESS);
    return false;
  }

  char16_t tmp;
  if (b->swapBytes) {
    std::uint8_t tmpBuf[2];
    tmpBuf[0] = *(b->buf + offset + 1);
    tmpBuf[1] = *(b->buf + offset);
    memcpy(&tmp, tmpBuf, sizeof(std::uint16_t));
  } else {
    memcpy(&tmp, (b->buf + offset), sizeof(std::uint16_t));
  }
  out = tmp;

  return true;
}